

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

arena_t * duckdb_je_arena_choose_hard(tsd_t *tsd,_Bool internal)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  arena_t *paVar6;
  uint *puVar7;
  char *pcVar8;
  bool bVar9;
  undefined7 in_register_00000031;
  ulong uVar10;
  atomic_p_t aVar11;
  atomic_p_t arena;
  char local_56 [2];
  uint local_54;
  arena_t *local_50;
  uint local_48 [2];
  tsd_t *local_40;
  ulong local_38;
  
  local_54 = duckdb_je_narenas_auto;
  if (duckdb_je_narenas_auto < 2) {
    aVar11.repr = duckdb_je_arenas[0].repr;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      aVar11.repr = (arena_t *)0x0;
    }
    arena_bind(tsd,0,false);
    arena = duckdb_je_arenas[0];
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena.repr = (arena_t *)0x0;
    }
    duckdb_je_arena_nthreads_inc((arena_t *)arena.repr,true);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena = (arena_t *)arena.repr;
    local_50 = (arena_t *)aVar11.repr;
  }
  else {
    local_48[0] = 0;
    local_48[1] = 0;
    local_56[0] = '\0';
    local_56[1] = 0;
    iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
    if (iVar3 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&duckdb_je_arenas_lock);
      duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
    }
    duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops =
         duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops + 1;
    if (&(duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
      duckdb_je_arenas_lock.field_0.witness.link.qre_prev =
           (witness_t *)(duckdb_je_arenas_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    }
    local_50 = (arena_t *)CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000031,internal));
    local_40 = tsd;
    if (1 < duckdb_je_narenas_auto) {
      uVar10 = 1;
      do {
        if (duckdb_je_arenas[uVar10].repr == (void *)0x0) {
          if (local_54 == duckdb_je_narenas_auto) {
            local_54 = (uint)uVar10;
          }
        }
        else {
          _Var2 = false;
          puVar7 = local_48;
          bVar1 = true;
          do {
            bVar9 = bVar1;
            paVar6 = (arena_t *)duckdb_je_arenas[uVar10].repr;
            if (paVar6 == (arena_t *)0x0) {
              paVar6 = (arena_t *)0x0;
            }
            uVar5 = duckdb_je_arena_nthreads_get(paVar6,_Var2);
            paVar6 = (arena_t *)duckdb_je_arenas[*puVar7].repr;
            if (paVar6 == (arena_t *)0x0) {
              paVar6 = (arena_t *)0x0;
            }
            uVar4 = duckdb_je_arena_nthreads_get(paVar6,_Var2);
            if (uVar5 < uVar4) {
              *puVar7 = (uint)uVar10;
            }
            _Var2 = true;
            puVar7 = local_48 + 1;
            tsd = local_40;
            bVar1 = false;
          } while (bVar9);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < duckdb_je_narenas_auto);
    }
    puVar7 = local_48;
    local_38 = (ulong)local_50 & 0xff;
    pcVar8 = local_56;
    _Var2 = false;
    uVar10 = 0;
    local_50 = (arena_t *)0x0;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      paVar6 = (arena_t *)duckdb_je_arenas[*puVar7].repr;
      if (paVar6 == (arena_t *)0x0) {
        paVar6 = (arena_t *)0x0;
      }
      uVar5 = duckdb_je_arena_nthreads_get(paVar6,_Var2);
      if ((uVar5 == 0) || (local_54 == duckdb_je_narenas_auto)) {
        if ((uVar10 == local_38) &&
           (local_50 = (arena_t *)duckdb_je_arenas[*puVar7].repr,
           (arena_t *)duckdb_je_arenas[*puVar7].repr == (arena_t *)0x0)) {
          local_50 = (arena_t *)0x0;
        }
      }
      else {
        *puVar7 = local_54;
        paVar6 = arena_init_locked((tsdn_t *)tsd,local_54,&duckdb_je_arena_config_default);
        if (paVar6 == (arena_t *)0x0) {
          duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
          return (arena_t *)0x0;
        }
        *pcVar8 = '\x01';
        if (uVar10 == local_38) {
          local_50 = paVar6;
        }
      }
      arena_bind(tsd,*puVar7,_Var2);
      uVar10 = 1;
      _Var2 = true;
      pcVar8 = local_56 + 1;
      puVar7 = local_48 + 1;
      bVar1 = false;
    } while (bVar9);
    duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
    puVar7 = local_48;
    pcVar8 = local_56;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      if (*pcVar8 == '\x01') {
        arena_new_create_background_thread((tsdn_t *)local_40,*puVar7);
      }
      puVar7 = local_48 + 1;
      pcVar8 = local_56 + 1;
      bVar1 = false;
    } while (bVar9);
  }
  return local_50;
}

Assistant:

arena_t *
arena_choose_hard(tsd_t *tsd, bool internal) {
	arena_t *ret JEMALLOC_CC_SILENCE_INIT(NULL);

	if (have_percpu_arena && PERCPU_ARENA_ENABLED(opt_percpu_arena)) {
		unsigned choose = percpu_arena_choose();
		ret = arena_get(tsd_tsdn(tsd), choose, true);
		assert(ret != NULL);
		arena_bind(tsd, arena_ind_get(ret), false);
		arena_bind(tsd, arena_ind_get(ret), true);

		return ret;
	}

	if (narenas_auto > 1) {
		unsigned i, j, choose[2], first_null;
		bool is_new_arena[2];

		/*
		 * Determine binding for both non-internal and internal
		 * allocation.
		 *
		 *   choose[0]: For application allocation.
		 *   choose[1]: For internal metadata allocation.
		 */

		for (j = 0; j < 2; j++) {
			choose[j] = 0;
			is_new_arena[j] = false;
		}

		first_null = narenas_auto;
		malloc_mutex_lock(tsd_tsdn(tsd), &arenas_lock);
		assert(arena_get(tsd_tsdn(tsd), 0, false) != NULL);
		for (i = 1; i < narenas_auto; i++) {
			if (arena_get(tsd_tsdn(tsd), i, false) != NULL) {
				/*
				 * Choose the first arena that has the lowest
				 * number of threads assigned to it.
				 */
				for (j = 0; j < 2; j++) {
					if (arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), i, false), !!j) <
					    arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), choose[j], false),
					    !!j)) {
						choose[j] = i;
					}
				}
			} else if (first_null == narenas_auto) {
				/*
				 * Record the index of the first uninitialized
				 * arena, in case all extant arenas are in use.
				 *
				 * NB: It is possible for there to be
				 * discontinuities in terms of initialized
				 * versus uninitialized arenas, due to the
				 * "thread.arena" mallctl.
				 */
				first_null = i;
			}
		}

		for (j = 0; j < 2; j++) {
			if (arena_nthreads_get(arena_get(tsd_tsdn(tsd),
			    choose[j], false), !!j) == 0 || first_null ==
			    narenas_auto) {
				/*
				 * Use an unloaded arena, or the least loaded
				 * arena if all arenas are already initialized.
				 */
				if (!!j == internal) {
					ret = arena_get(tsd_tsdn(tsd),
					    choose[j], false);
				}
			} else {
				arena_t *arena;

				/* Initialize a new arena. */
				choose[j] = first_null;
				arena = arena_init_locked(tsd_tsdn(tsd),
				    choose[j], &arena_config_default);
				if (arena == NULL) {
					malloc_mutex_unlock(tsd_tsdn(tsd),
					    &arenas_lock);
					return NULL;
				}
				is_new_arena[j] = true;
				if (!!j == internal) {
					ret = arena;
				}
			}
			arena_bind(tsd, choose[j], !!j);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &arenas_lock);

		for (j = 0; j < 2; j++) {
			if (is_new_arena[j]) {
				assert(choose[j] > 0);
				arena_new_create_background_thread(
				    tsd_tsdn(tsd), choose[j]);
			}
		}

	} else {
		ret = arena_get(tsd_tsdn(tsd), 0, false);
		arena_bind(tsd, 0, false);
		arena_bind(tsd, 0, true);
	}

	return ret;
}